

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O0

void __thiscall NaTransFunc::Clean(NaTransFunc *this)

{
  long in_RDI;
  uint in_stack_0000000c;
  
  if (*(uint *)(in_RDI + 0x40) < 2) {
    NaDynAr<NaTransFunc_*>::clean((NaDynAr<NaTransFunc_*> *)this);
  }
  else if (*(uint *)(in_RDI + 0x40) != 2) goto LAB_0016e74e;
  NaVector::new_dim((NaVector *)this,in_stack_0000000c);
  NaVector::new_dim((NaVector *)this,in_stack_0000000c);
LAB_0016e74e:
  *(undefined4 *)(in_RDI + 0x40) = 2;
  return;
}

Assistant:

void
NaTransFunc::Clean ()
{
    switch(ut){
    case utSum:
    case utProduct:
        items.clean();
        // no break;
    case utPolyFrac:
        pf.num.new_dim(0);
        pf.den.new_dim(0);
        break;
    }
    ut = utPolyFrac;
}